

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mir-gen.c
# Opt level: O0

void add_inout_reloads(gen_ctx_t gen_ctx,MIR_insn_t insn)

{
  int iVar1;
  MIR_op_mode_t mode_00;
  MIR_op_mode_t MVar2;
  MIR_type_t type_00;
  MIR_reg_t var;
  size_t sVar3;
  VARR_size_t **__dest;
  MIR_module *__dest_00;
  MIR_op_t local_98;
  undefined1 local_68 [8];
  MIR_op_t temp_op;
  MIR_reg_t temp_reg;
  MIR_type_t type;
  MIR_op_mode_t mode;
  int out_p;
  MIR_context_t ctx;
  MIR_insn_t insn_local;
  gen_ctx_t gen_ctx_local;
  
  _mode = gen_ctx->ctx;
  ctx = (MIR_context_t)insn;
  insn_local = (MIR_insn_t)gen_ctx;
  sVar3 = MIR_insn_nops(_mode,insn);
  if (1 < sVar3) {
    iVar1 = MIR_call_code_p((MIR_insn_code_t)*(undefined8 *)&ctx->func_redef_permission_p);
    if ((iVar1 == 0) && ((int)*(undefined8 *)&ctx->func_redef_permission_p != 0xab)) {
      MIR_insn_op_mode(_mode,(MIR_insn_t_conflict)ctx,1,(int *)&type);
      if (type != MIR_T_I8) {
        __assert_fail("!out_p",
                      "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/mir/mir-gen.c"
                      ,0x1b95,"void add_inout_reloads(gen_ctx_t, MIR_insn_t)");
      }
      mode_00 = MIR_insn_op_mode(_mode,(MIR_insn_t_conflict)ctx,0,(int *)&type);
      if (type != MIR_T_I8) {
        MVar2 = MIR_insn_op_mode(_mode,(MIR_insn_t_conflict)ctx,1,(int *)&type);
        if ((mode_00 == MVar2) && (type == MIR_T_I8)) {
          type_00 = mode2type(mode_00);
          var = gen_new_temp_reg((gen_ctx_t)insn_local,type_00,
                                 *(MIR_func_t *)
                                  ((long)&((insn_local->insn_link).next)->ops[0].u + 0x10));
          _MIR_new_var_op(&local_98,_mode,var);
          memcpy(local_68,&local_98,0x30);
          add_reload((gen_ctx_t)insn_local,(MIR_insn_t)ctx,(MIR_op_t *)&ctx->environment_module,
                     (MIR_op_t *)local_68,type_00,0);
          add_reload((gen_ctx_t)insn_local,(MIR_insn_t)ctx,(MIR_op_t *)&ctx->insn_nops,
                     (MIR_op_t *)local_68,type_00,1);
          __dest = &ctx->insn_nops;
          __dest_00 = &ctx->environment_module;
          memcpy(__dest_00,local_68,0x30);
          memcpy(__dest,__dest_00,0x30);
          return;
        }
      }
      __assert_fail("out_p && mode == MIR_insn_op_mode (ctx, insn, 1, &out_p) && !out_p",
                    "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/mir/mir-gen.c"
                    ,0x1b97,"void add_inout_reloads(gen_ctx_t, MIR_insn_t)");
    }
  }
  __assert_fail("MIR_insn_nops (ctx, insn) >= 2 && !MIR_call_code_p (insn->code) && insn->code != MIR_RET"
                ,
                "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/mir/mir-gen.c"
                ,0x1b93,"void add_inout_reloads(gen_ctx_t, MIR_insn_t)");
}

Assistant:

static void add_inout_reloads (gen_ctx_t gen_ctx, MIR_insn_t insn) {
  MIR_context_t ctx = gen_ctx->ctx;
  int out_p;
  MIR_op_mode_t mode;
  MIR_type_t type;
  MIR_reg_t temp_reg;
  MIR_op_t temp_op;

  gen_assert (MIR_insn_nops (ctx, insn) >= 2 && !MIR_call_code_p (insn->code)
              && insn->code != MIR_RET);
  MIR_insn_op_mode (ctx, insn, 1, &out_p);
  gen_assert (!out_p);
  mode = MIR_insn_op_mode (ctx, insn, 0, &out_p);
  gen_assert (out_p && mode == MIR_insn_op_mode (ctx, insn, 1, &out_p) && !out_p);
  type = mode2type (mode);
  temp_reg = gen_new_temp_reg (gen_ctx, type, curr_func_item->u.func);
  temp_op = _MIR_new_var_op (ctx, temp_reg);
  add_reload (gen_ctx, insn, &insn->ops[1], &temp_op, type, FALSE);
  add_reload (gen_ctx, insn, &insn->ops[0], &temp_op, type, TRUE);
  insn->ops[0] = insn->ops[1] = temp_op;
}